

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.hpp
# Opt level: O2

Vector<double,_2U> * __thiscall
OpenMD::Vector<double,_2U>::operator=(Vector<double,_2U> *this,Vector<double,_2U> *v)

{
  uint i;
  long lVar1;
  
  if (this != v) {
    for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
      this->data_[lVar1] = v->data_[lVar1];
    }
  }
  return this;
}

Assistant:

inline Vector<Real, Dim>& operator=(const Vector<Real, Dim>& v) {
      if (this == &v) return *this;

      for (unsigned int i = 0; i < Dim; i++)
        this->data_[i] = v[i];

      return *this;
    }